

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O0

void EPD_DrawEllipse(uint16_t Xpos,uint16_t Ypos,uint16_t XRadius,uint16_t YRadius,uint8_t color)

{
  short sVar1;
  float fVar2;
  float fVar3;
  float rad2;
  float rad1;
  float k;
  int32_t e2;
  int32_t err;
  int32_t y;
  int32_t x;
  uint8_t color_local;
  uint16_t YRadius_local;
  uint16_t XRadius_local;
  uint16_t Ypos_local;
  uint16_t Xpos_local;
  
  err = 0;
  e2 = -(uint)YRadius;
  k = (float)((uint)XRadius * -2 + 2);
  fVar3 = (float)YRadius / (float)XRadius;
  do {
    sVar1 = (short)e2;
    EPD_DrawPixel(Xpos - (short)(int)((float)err / fVar3),Ypos + sVar1,color);
    EPD_DrawPixel(Xpos + (short)(int)((float)err / fVar3),Ypos + sVar1,color);
    EPD_DrawPixel(Xpos + (short)(int)((float)err / fVar3),Ypos - sVar1,color);
    EPD_DrawPixel(Xpos - (short)(int)((float)err / fVar3),Ypos - sVar1,color);
    rad1 = k;
    fVar2 = k;
    if ((int)k <= err) {
      err = err + 1;
      fVar2 = (float)(err * 2 + 1 + (int)k);
      if ((-e2 == err) && ((int)k <= e2)) {
        rad1 = 0.0;
      }
    }
    k = fVar2;
    if (e2 < (int)rad1) {
      e2 = e2 + 1;
      k = (float)(e2 * 2 + 1 + (int)k);
    }
  } while (e2 < 1);
  return;
}

Assistant:

void EPD_DrawEllipse(uint16_t Xpos, uint16_t Ypos, uint16_t XRadius, uint16_t YRadius, uint8_t color)
{
  int32_t x = 0, y = -YRadius, err = 2-2*XRadius, e2;
  float k = 0, rad1 = 0, rad2 = 0;
  
  rad1 = XRadius;
  rad2 = YRadius;
  
  k = (float)(rad2/rad1);  
  
  do { 
    EPD_DrawPixel((Xpos-(uint16_t)(x/k)), (Ypos+y), color);
    EPD_DrawPixel((Xpos+(uint16_t)(x/k)), (Ypos+y), color);
    EPD_DrawPixel((Xpos+(uint16_t)(x/k)), (Ypos-y), color);
    EPD_DrawPixel((Xpos-(uint16_t)(x/k)), (Ypos-y), color);      
    
    e2 = err;
    if (e2 <= x) {
      err += ++x*2+1;
      if (-y == x && e2 <= y) e2 = 0;
    }
    if (e2 > y) err += ++y*2+1;     
  }
  while (y <= 0);
}